

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O2

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> * __thiscall
vk::SimpleAllocator::allocate
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          SimpleAllocator *this,VkMemoryAllocateInfo *allocInfo,VkDeviceSize alignment)

{
  PtrData<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  data;
  HostPtr *this_00;
  SimpleAllocation *this_01;
  VkDeviceSize in_R9;
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  hostPtr;
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_98;
  Move<vk::Handle<(vk::HandleType)7>_> mem;
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_68;
  RefBase<vk::Handle<(vk::HandleType)7>_> local_58;
  
  allocateMemory(&mem,this->m_vk,this->m_device,allocInfo,(VkAllocationCallbacks *)0x0);
  hostPtr.
  super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  .m_data.ptr._0_4_ = 0;
  hostPtr.
  super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  .m_data.ptr._4_4_ = 0;
  if (((this->m_memProps).memoryTypes[allocInfo->memoryTypeIndex].propertyFlags & 2) != 0) {
    this_00 = (HostPtr *)operator_new(0x20);
    anon_unknown_6::HostPtr::HostPtr
              (this_00,this->m_vk,this->m_device,
               (VkDeviceMemory)
               mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal,
               allocInfo->allocationSize,in_R9,
               (VkMemoryMapFlags)
               hostPtr.
               super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
               .m_data.ptr);
    local_98.m_data.ptr = (HostPtr *)0x0;
    data.ptr._4_4_ =
         hostPtr.
         super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
         .m_data.ptr._4_4_;
    data.ptr._0_4_ =
         (VkMemoryMapFlags)
         hostPtr.
         super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
         .m_data.ptr;
    data._8_8_ = hostPtr.
                 super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                 .m_data._8_8_;
    de::details::
    MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
    ::operator=(&hostPtr,data);
    de::details::
    UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
    ::~UniqueBase(&local_98);
  }
  this_01 = (SimpleAllocation *)operator_new(0x50);
  local_58.m_data.deleter.m_device =
       mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device;
  local_58.m_data.deleter.m_allocator =
       mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator;
  local_58.m_data.object.m_internal =
       mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal;
  local_58.m_data.deleter.m_deviceIface =
       mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface;
  local_68.m_data.ptr =
       (HostPtr *)
       CONCAT44(hostPtr.
                super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                .m_data.ptr._4_4_,
                (VkMemoryMapFlags)
                hostPtr.
                super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                .m_data.ptr);
  hostPtr.
  super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  .m_data.ptr._0_4_ = 0;
  hostPtr.
  super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  .m_data.ptr._4_4_ = 0;
  mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.object.m_internal = 0;
  mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_device = (VkDevice)0x0;
  mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  SimpleAllocation::SimpleAllocation
            (this_01,(Move<vk::Handle<(vk::HandleType)7>_> *)&local_58,
             (MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
              *)&local_68);
  (__return_storage_ptr__->super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>).
  m_data.ptr = (Allocation *)this_01;
  de::details::
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::~UniqueBase(&local_68);
  refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase(&local_58);
  de::details::
  UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::~UniqueBase(&hostPtr.
                 super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
               );
  refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::~RefBase
            (&mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Allocation> SimpleAllocator::allocate (const VkMemoryAllocateInfo& allocInfo, VkDeviceSize alignment)
{
	DE_UNREF(alignment);

	Move<VkDeviceMemory>	mem		= allocateMemory(m_vk, m_device, &allocInfo);
	MovePtr<HostPtr>		hostPtr;

	if (isHostVisibleMemory(m_memProps, allocInfo.memoryTypeIndex))
		hostPtr = MovePtr<HostPtr>(new HostPtr(m_vk, m_device, *mem, 0u, allocInfo.allocationSize, 0u));

	return MovePtr<Allocation>(new SimpleAllocation(mem, hostPtr));
}